

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_submit.c
# Opt level: O2

int nghttp2_submit_data(nghttp2_session *session,uint8_t flags,int32_t stream_id,
                       nghttp2_data_provider *data_prd)

{
  nghttp2_data_source_read_callback p_Var1;
  int iVar2;
  nghttp2_outbound_item *item;
  int iVar3;
  
  if (stream_id == 0) {
    iVar3 = -0x1f5;
  }
  else {
    item = (nghttp2_outbound_item *)nghttp2_mem_malloc(&session->mem,0x98);
    if (item == (nghttp2_outbound_item *)0x0) {
      iVar3 = -0x385;
    }
    else {
      nghttp2_outbound_item_init(item);
      p_Var1 = data_prd->read_callback;
      (item->aux_data).data.data_prd.source = data_prd->source;
      (item->aux_data).data.data_prd.read_callback = p_Var1;
      (item->aux_data).data.eof = '\0';
      (item->aux_data).data.flags = flags & 1;
      nghttp2_frame_data_init((nghttp2_data *)item,'\0',stream_id);
      iVar2 = nghttp2_session_add_item(session,item);
      iVar3 = 0;
      if (iVar2 != 0) {
        nghttp2_frame_data_free((nghttp2_data *)item);
        nghttp2_mem_free(&session->mem,item);
        iVar3 = iVar2;
      }
    }
  }
  return iVar3;
}

Assistant:

int nghttp2_submit_data(nghttp2_session *session, uint8_t flags,
                        int32_t stream_id,
                        const nghttp2_data_provider *data_prd) {
  int rv;
  nghttp2_outbound_item *item;
  nghttp2_frame *frame;
  nghttp2_data_aux_data *aux_data;
  uint8_t nflags = flags & NGHTTP2_FLAG_END_STREAM;
  nghttp2_mem *mem;

  mem = &session->mem;

  if (stream_id == 0) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  item = nghttp2_mem_malloc(mem, sizeof(nghttp2_outbound_item));
  if (item == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  nghttp2_outbound_item_init(item);

  frame = &item->frame;
  aux_data = &item->aux_data.data;
  aux_data->data_prd = *data_prd;
  aux_data->eof = 0;
  aux_data->flags = nflags;

  /* flags are sent on transmission */
  nghttp2_frame_data_init(&frame->data, NGHTTP2_FLAG_NONE, stream_id);

  rv = nghttp2_session_add_item(session, item);
  if (rv != 0) {
    nghttp2_frame_data_free(&frame->data);
    nghttp2_mem_free(mem, item);
    return rv;
  }
  return 0;
}